

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

size_t wwLoZeroBits(word *a,size_t n)

{
  ulong in_RSI;
  long in_RDI;
  bool bVar1;
  size_t i;
  undefined8 local_20;
  undefined8 local_8;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if (local_20 < in_RSI) {
      bVar1 = *(long *)(in_RDI + local_20 * 8) == 0;
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  if (local_20 == in_RSI) {
    local_8 = in_RSI << 6;
  }
  else {
    local_8 = u64CTZ(0x1685c8);
    local_8 = local_20 * 0x40 + local_8;
  }
  return local_8;
}

Assistant:

size_t wwLoZeroBits(const word a[], size_t n)
{
	register size_t i;
	ASSERT(wwIsValid(a, n));
	// поиск младшего ненулевого машинного слова
	for (i = 0; i < n && a[i] == 0; ++i);
	// нулевое слово?
	if (i == n)
		return n * B_PER_W;
	// ...ненулевое
	return i * B_PER_W + wordCTZ(a[i]);
}